

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1,x86Size size,x86Reg index
                     ,int multiplier,x86Reg base,uint shift)

{
  ArgType AVar1;
  x86Instruction *pxVar2;
  x86Argument arg;
  uint uVar3;
  int iVar4;
  x86Reg xVar5;
  uint uVar6;
  int *piVar7;
  ulong uVar8;
  x86Reg xVar9;
  x86Argument address;
  int local_58;
  x86Reg local_54;
  x86Argument local_50;
  
  uVar8 = (ulong)base;
  local_58 = multiplier;
  local_54 = index;
  if (ctx->skipTracking == false) {
    CodeGenGenericContext::RedirectAddressComputation(ctx,&local_54,&local_58,&base,&shift);
    uVar8 = (ulong)base;
    ctx->genRegRead[uVar8] = true;
    ctx->genRegRead[local_54] = true;
  }
  xVar5 = local_54;
  iVar4 = local_58;
  uVar3 = shift;
  local_50.type = argPtr;
  xVar9 = (x86Reg)uVar8;
  local_50.field_1.ptrSize = size;
  local_50.ptrBase = xVar9;
  local_50.ptrIndex = local_54;
  local_50.ptrMult = local_58;
  local_50.ptrNum = shift;
  if (0x29 < (int)op) {
    uVar8 = (ulong)(op - o_cvttsd2si);
    if (op - o_cvttsd2si < 0x21) {
      if ((0x170e00001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_001c987e;
      if (uVar8 == 0x13) goto LAB_001c9980;
      if (uVar8 != 0x1f) goto LAB_001c995a;
    }
    else {
LAB_001c995a:
      if (op != o_cmp) {
        if (op != o_movsxd) {
LAB_001c9b16:
          __assert_fail("!\"unknown instruction\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                        ,0x622,
                        "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                       );
        }
        goto LAB_001c996e;
      }
    }
    CodeGenGenericContext::MemRead(ctx,&local_50);
    ctx->genRegRead[reg1] = true;
    goto LAB_001c98cd;
  }
  if ((int)op < 0x1f) {
    if ((int)op < 5) {
      if (op == o_mov) {
LAB_001c9980:
        if (ctx->skipTracking == false) {
          uVar6 = CodeGenGenericContext::MemFind(ctx,&local_50);
          if (uVar6 != 0) {
            uVar6 = uVar6 - 1;
            AVar1 = ctx->memCache[uVar6].value.type;
            if (AVar1 == argNumber) {
              EMIT_OP_REG_NUM(ctx,op,reg1,ctx->memCache[uVar6].value.field_1.labelID);
              return;
            }
            if (AVar1 == argReg) {
              if (ctx->memCache[uVar6].address.field_1.reg != (op != o_mov) + rECX) {
                __assert_fail("ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                              ,0x5dc,
                              "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86Reg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                             );
              }
              uVar8 = (ulong)ctx->memCache[uVar6].value.field_1.reg;
LAB_001c9a28:
              EMIT_OP_REG_REG(ctx,op,reg1,(x86Reg)uVar8);
              return;
            }
          }
          piVar7 = &ctx->genReg[0].ptrNum;
          uVar8 = 0;
          do {
            if (((((((x86Argument *)(piVar7 + -7))->type == argPtr) &&
                  (((anon_union_8_6_73be8994_for_x86Argument_2 *)(piVar7 + -5))->reg == size)) &&
                 (piVar7[-3] == xVar9)) && ((piVar7[-2] == xVar5 && (piVar7[-1] == iVar4)))) &&
               (*piVar7 == uVar3)) goto LAB_001c9a28;
            uVar8 = uVar8 + 1;
            piVar7 = piVar7 + 8;
          } while (uVar8 != 0x11);
          CodeGenGenericContext::MemRead(ctx,&local_50);
          if (xVar5 == reg1 || xVar9 == reg1) {
            CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
          }
          else {
            arg._4_4_ = local_50._4_4_;
            arg.type = local_50.type;
            arg.field_1.imm64Arg._4_4_ = local_50.field_1.imm64Arg._4_4_;
            arg.field_1.ptrSize = local_50.field_1.reg;
            arg.ptrIndex = local_50.ptrIndex;
            arg.ptrBase = local_50.ptrBase;
            arg.ptrNum = local_50.ptrNum;
            arg.ptrMult = local_50.ptrMult;
            CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
          }
        }
        goto LAB_001c98cd;
      }
      if (op != o_movsx) goto LAB_001c9b16;
LAB_001c996e:
      CodeGenGenericContext::MemRead(ctx,&local_50);
    }
    else {
      if (op != o_lea) {
        if (op != o_add) goto LAB_001c9b16;
        goto LAB_001c987e;
      }
      if (local_54 == rNONE && shift == 0) {
        op = o_mov64;
        goto LAB_001c9a28;
      }
    }
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
  }
  else {
    if (((2 < op - o_and) && (op != o_sub)) && (op != o_imul)) goto LAB_001c9b16;
LAB_001c987e:
    CodeGenGenericContext::MemRead(ctx,&local_50);
    CodeGenGenericContext::InvalidateDependand(ctx,reg1);
    ctx->genReg[reg1].type = argNone;
    ctx->genRegUpdate[reg1] =
         (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    ctx->genRegRead[reg1] = false;
  }
LAB_001c98cd:
  pxVar2 = ctx->x86Op;
  pxVar2->name = op;
  (pxVar2->argA).type = argReg;
  (pxVar2->argA).field_1.reg = reg1;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).type = argPtr;
  (pxVar2->argB).field_1.ptrSize = size;
  pxVar2 = ctx->x86Op;
  (pxVar2->argB).ptrIndex = xVar5;
  (pxVar2->argB).ptrMult = iVar4;
  (pxVar2->argB).ptrBase = xVar9;
  (pxVar2->argB).ptrNum = uVar3;
  ctx->x86Op = pxVar2 + 1;
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	if(!ctx.skipTracking)
	{
		ctx.RedirectAddressComputation(index, multiplier, base, shift);

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);
	}

	x86Argument address = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_mov:
	case o_mov64:
		if(ctx.skipTracking)
			break;

		if(unsigned memIndex = ctx.MemFind(address))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == (op == o_mov ? sDWORD : sQWORD));

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
			else if(ctx.memCache[memIndex].value.type == x86Argument::argNumber)
			{
				EMIT_OP_REG_NUM(ctx, op, reg1, ctx.memCache[memIndex].value.num);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rRegCount; i++)
		{
			if(ctx.genReg[i].type == x86Argument::argPtr && ctx.genReg[i] == address)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86Reg)i);
				return;
			}
		}

		ctx.MemRead(address);

		// If write doesn't invalidate the source registers, mark that register contains value from source address
		if(reg1 != base && reg1 != index)
			ctx.OverwriteRegisterWithValue(reg1, address);
		else
			ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movsx:
	case o_movsxd:
		ctx.MemRead(address);

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_lea:
		if(index == rNONE && shift == 0)
		{
			EMIT_OP_REG_REG(ctx, sizeof(void*) == 8 ? o_mov64 : o_mov, reg1, base);
			return;
		}

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvttsd2si:
	case o_cvttsd2si64:
	case o_add:
	case o_sub:
	case o_imul:
	case o_and:
	case o_or:
	case o_xor:
	case o_add64:
	case o_sub64:
	case o_imul64:
	case o_and64:
	case o_or64:
	case o_xor64:
		ctx.MemRead(address);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_cmp:
	case o_cmp64:
		ctx.MemRead(address);

		ctx.ReadRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}